

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::PopulateChildren
          (Node *this,TypeInfo *typeinfo)

{
  bool use_ints_for_enums;
  string *psVar1;
  pointer pcVar2;
  size_t size;
  pointer ppNVar3;
  bool bVar4;
  int iVar5;
  Node *field;
  iterator iVar6;
  long lVar7;
  LogMessage *pLVar8;
  Node *pNVar9;
  pointer ppNVar10;
  NodeKind kind;
  ulong uVar11;
  Node **__args;
  pointer ppNVar12;
  Type *pTVar13;
  byte bVar14;
  undefined1 local_168 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  orig_children_map;
  StatusOr<const_google::protobuf::Type_*> found_result;
  code *local_f0;
  undefined1 local_d0 [32];
  bool local_b0;
  undefined1 auStack_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  Type *local_78;
  undefined1 auStack_58 [8];
  vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  new_children;
  LogFinisher local_31;
  
  if (((((this->type_ != (Type *)0x0) &&
        (iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_), iVar5 != 0)) &&
       (iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_), iVar5 != 0)) &&
      ((iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_), iVar5 != 0 &&
       (iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_), iVar5 != 0)))) &&
     (iVar5 = std::__cxx11::string::compare((char *)(this->type_->name_).ptr_), iVar5 != 0)) {
    auStack_58 = (undefined1  [8])0x0;
    new_children.
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_children.
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168 = (undefined1  [8])&orig_children_map._M_h._M_rehash_policy._M_next_resize;
    orig_children_map._M_h._M_buckets = (__buckets_ptr)0x1;
    orig_children_map._M_h._M_bucket_count = 0;
    orig_children_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    orig_children_map._M_h._M_element_count._0_4_ = 0x3f800000;
    orig_children_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    orig_children_map._M_h._M_rehash_policy._4_4_ = 0;
    orig_children_map._M_h._M_rehash_policy._M_next_resize = 0;
    local_d0._0_8_ = (ulong)(uint)local_d0._4_4_ << 0x20;
    ppNVar12 = (this->children_).
               super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppNVar10 = (this->children_).
               super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppNVar10 != ppNVar12) {
      uVar11 = 0;
      do {
        InsertIfNotPresent<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                  ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)local_168,&ppNVar12[uVar11]->name_,(second_type *)local_d0);
        uVar11 = (long)(int)local_d0._0_4_ + 1;
        local_d0._0_4_ = (int)uVar11;
        ppNVar12 = (this->children_).
                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppNVar10 = (this->children_).
                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while (uVar11 < (ulong)((long)ppNVar10 - (long)ppNVar12 >> 3));
    }
    pTVar13 = this->type_;
    if (0 < (pTVar13->fields_).super_RepeatedPtrFieldBase.current_size_) {
      path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->field_scrub_callback_;
      iVar5 = 0;
      do {
        field = (Node *)protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<google::protobuf::Field>::TypeHandler>
                                  (&(pTVar13->fields_).super_RepeatedPtrFieldBase,iVar5);
        auStack_98 = (undefined1  [8])0x0;
        path.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        path.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((this->path_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->path_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_98
                     ,0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_98,((ArenaStringPtr *)&field->type_)->ptr_);
        if (((this->field_scrub_callback_).super__Function_base._M_manager == (_Manager_type)0x0) ||
           (local_d0._0_8_ = field,
           bVar4 = (*(this->field_scrub_callback_)._M_invoker)
                             ((_Any_data *)
                              path.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)auStack_98,(Field **)local_d0), !bVar4)) {
          iVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_168,((ArenaStringPtr *)&field->type_)->ptr_);
          if (iVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
              ._M_cur == (__node_type *)0x0) {
            if ((field->data_).field_2.i32_ == 0xb) {
              psVar1 = ((ArenaStringPtr *)&field->kind_)->ptr_;
              pcVar2 = (psVar1->_M_dataplus)._M_p;
              size = psVar1->_M_string_length;
              if ((long)size < 0) {
                StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
              }
              (*typeinfo->_vptr_TypeInfo[2])
                        (&orig_children_map._M_h._M_single_bucket,typeinfo,pcVar2,size);
              local_78 = (Type *)found_result.status_.error_message_.field_2._8_8_;
              if ((int)orig_children_map._M_h._M_single_bucket == 0) {
                pNVar9 = field;
                bVar4 = IsMap((Field *)field,
                              (Type *)found_result.status_.error_message_.field_2._8_8_);
                if (!bVar4) goto LAB_00308ceb;
                local_78 = GetMapValueType(pNVar9,local_78,typeinfo);
                kind = MAP;
                bVar4 = true;
              }
              else {
                protobuf::internal::LogMessage::LogMessage
                          ((LogMessage *)local_d0,LOGLEVEL_WARNING,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/default_value_objectwriter.cc"
                           ,0x163);
                pLVar8 = protobuf::internal::LogMessage::operator<<
                                   ((LogMessage *)local_d0,"Cannot resolve type \'");
                pLVar8 = protobuf::internal::LogMessage::operator<<
                                   (pLVar8,((ArenaStringPtr *)&field->kind_)->ptr_);
                pLVar8 = protobuf::internal::LogMessage::operator<<(pLVar8,"\'.");
                protobuf::internal::LogFinisher::operator=(&local_31,pLVar8);
                protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d0);
                local_78 = (Type *)0x0;
LAB_00308ceb:
                kind = OBJECT;
                bVar4 = false;
              }
              if ((size_type *)found_result.status_._0_8_ !=
                  &found_result.status_.error_message_._M_string_length) {
                operator_delete((void *)found_result.status_._0_8_);
              }
              if (!bVar4) goto LAB_00308d18;
              bVar4 = false;
            }
            else {
              kind = PRIMITIVE;
              local_78 = (Type *)0x0;
LAB_00308d18:
              if (*(int *)((long)&(field->data_).field_2 + 4) == 3) {
                kind = LIST;
              }
              bVar4 = kind == PRIMITIVE;
              if (*(int32 *)((long)&(field->data_).field_2 + 0xc) != 0 && bVar4) goto LAB_00308c81;
            }
            pNVar9 = (Node *)operator_new(0xc0);
            bVar14 = this->preserve_proto_field_names_;
            psVar1 = *(string **)
                      ((long)&((ArenaStringPtr *)&field->type_)->ptr_ + (ulong)((bVar14 ^ 1) << 4));
            if (bVar4) {
              CreateDefaultDataPieceForField
                        ((DataPiece *)local_d0,(Field *)field,typeinfo,this->use_ints_for_enums_);
              bVar14 = this->preserve_proto_field_names_;
            }
            else {
              local_d0._0_8_ = &PTR__DataPiece_003bcd00;
              local_d0._8_4_ = TYPE_NULL;
              local_d0._16_4_ = 0;
              local_b0 = false;
            }
            bVar4 = this->suppress_empty_list_;
            use_ints_for_enums = this->use_ints_for_enums_;
            std::
            function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
            ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
                        *)&found_result.value_,
                       (function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
                        *)path.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Node(pNVar9,psVar1,local_78,kind,(DataPiece *)local_d0,true,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_98,bVar4,(bool)(bVar14 & 1),use_ints_for_enums,
                 (FieldScrubCallBack *)&found_result.value_);
            if (local_f0 != (code *)0x0) {
              (*local_f0)((_Any_data *)&found_result.value_,(_Any_data *)&found_result.value_,
                          __destroy_functor);
            }
            local_d0._0_8_ = pNVar9;
            if (new_children.
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                new_children.
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
              ::
              _M_realloc_insert<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>
                        ((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
                          *)auStack_58,
                         (iterator)
                         new_children.
                         super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,(Node **)local_d0);
            }
            else {
              *new_children.
               super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_start = pNVar9;
              new_children.
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   new_children.
                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          else {
            lVar7 = (long)*(int *)((long)iVar6.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                         ._M_cur + 0x28);
            __args = (this->children_).
                     super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar7;
            if (new_children.
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                new_children.
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
              ::
              _M_realloc_insert<google::protobuf::util::converter::DefaultValueObjectWriter::Node*const&>
                        ((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
                          *)auStack_58,
                         (iterator)
                         new_children.
                         super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,__args);
              lVar7 = (long)*(int *)((long)iVar6.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                           ._M_cur + 0x28);
            }
            else {
              *new_children.
               super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_start = *__args;
              new_children.
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   new_children.
                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
            (this->children_).
            super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar7] = (Node *)0x0;
          }
        }
LAB_00308c81:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_98);
        iVar5 = iVar5 + 1;
        pTVar13 = this->type_;
      } while (iVar5 < (pTVar13->fields_).super_RepeatedPtrFieldBase.current_size_);
      ppNVar12 = (this->children_).
                 super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppNVar10 = (this->children_).
                 super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (ppNVar10 != ppNVar12) {
      lVar7 = 0;
      uVar11 = 0;
      do {
        if (*(long *)((long)ppNVar12 + lVar7) != 0) {
          std::
          vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
          ::insert((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                    *)auStack_58,(const_iterator)auStack_58,(value_type *)((long)ppNVar12 + lVar7));
          *(undefined8 *)
           ((long)(this->children_).
                  super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar7) = 0;
          ppNVar12 = (this->children_).
                     super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppNVar10 = (this->children_).
                     super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar11 = uVar11 + 1;
        lVar7 = lVar7 + 8;
      } while (uVar11 < (ulong)((long)ppNVar10 - (long)ppNVar12 >> 3));
    }
    ppNVar3 = (this->children_).
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->children_).
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
    (this->children_).
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         new_children.
         super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->children_).
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         new_children.
         super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_58 = (undefined1  [8])ppNVar12;
    new_children.
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppNVar10;
    new_children.
    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppNVar3;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_168);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58);
    }
  }
  return;
}

Assistant:

void DefaultValueObjectWriter::Node::PopulateChildren(
    const TypeInfo* typeinfo) {
  // Ignores well known types that don't require automatically populating their
  // primitive children. For type "Any", we only populate its children when the
  // "@type" field is set.
  // TODO(tsun): remove "kStructValueType" from the list. It's being checked
  //     now because of a bug in the tool-chain that causes the "oneof_index"
  //     of kStructValueType to not be set correctly.
  if (type_ == nullptr || type_->name() == kAnyType ||
      type_->name() == kStructType || type_->name() == kTimestampType ||
      type_->name() == kDurationType || type_->name() == kStructValueType) {
    return;
  }
  std::vector<Node*> new_children;
  std::unordered_map<std::string, int> orig_children_map;

  // Creates a map of child nodes to speed up lookup.
  for (int i = 0; i < children_.size(); ++i) {
    InsertIfNotPresent(&orig_children_map, children_[i]->name_, i);
  }

  for (int i = 0; i < type_->fields_size(); ++i) {
    const google::protobuf::Field& field = type_->fields(i);

    // This code is checking if the field to be added to the tree should be
    // scrubbed or not by calling the field_scrub_callback_ callback function.
    std::vector<std::string> path;
    if (!path_.empty()) {
      path.insert(path.begin(), path_.begin(), path_.end());
    }
    path.push_back(field.name());
    if (field_scrub_callback_ && field_scrub_callback_(path, &field)) {
      continue;
    }

    std::unordered_map<std::string, int>::iterator found =
        orig_children_map.find(field.name());
    // If the child field has already been set, we just add it to the new list
    // of children.
    if (found != orig_children_map.end()) {
      new_children.push_back(children_[found->second]);
      children_[found->second] = nullptr;
      continue;
    }

    const google::protobuf::Type* field_type = nullptr;
    bool is_map = false;
    NodeKind kind = PRIMITIVE;

    if (field.kind() == google::protobuf::Field::TYPE_MESSAGE) {
      kind = OBJECT;
      util::StatusOr<const google::protobuf::Type*> found_result =
          typeinfo->ResolveTypeUrl(field.type_url());
      if (!found_result.ok()) {
        // "field" is of an unknown type.
        GOOGLE_LOG(WARNING) << "Cannot resolve type '" << field.type_url() << "'.";
      } else {
        const google::protobuf::Type* found_type = found_result.value();
        is_map = IsMap(field, *found_type);

        if (!is_map) {
          field_type = found_type;
        } else {
          // If this field is a map, we should use the type of its "Value" as
          // the type of the child node.
          field_type = GetMapValueType(*found_type, typeinfo);
          kind = MAP;
        }
      }
    }

    if (!is_map &&
        field.cardinality() == google::protobuf::Field::CARDINALITY_REPEATED) {
      kind = LIST;
    }

    // If oneof_index() != 0, the child field is part of a "oneof", which means
    // the child field is optional and we shouldn't populate its default
    // primitive value.
    if (field.oneof_index() != 0 && kind == PRIMITIVE) continue;

    // If the child field is of primitive type, sets its data to the default
    // value of its type.
    std::unique_ptr<Node> child(
        new Node(preserve_proto_field_names_ ? field.name() : field.json_name(),
                 field_type, kind,
                 kind == PRIMITIVE ? CreateDefaultDataPieceForField(
                                         field, typeinfo, use_ints_for_enums_)
                                   : DataPiece::NullData(),
                 true, path, suppress_empty_list_, preserve_proto_field_names_,
                 use_ints_for_enums_, field_scrub_callback_));
    new_children.push_back(child.release());
  }
  // Adds all leftover nodes in children_ to the beginning of new_child.
  for (int i = 0; i < children_.size(); ++i) {
    if (children_[i] == nullptr) {
      continue;
    }
    new_children.insert(new_children.begin(), children_[i]);
    children_[i] = nullptr;
  }
  children_.swap(new_children);
}